

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O2

void multiply_mat(double *m1,double *m2,double *res,int m1_rows,int inner_dim,int m2_cols)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  double dVar9;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < inner_dim) {
    uVar4 = (ulong)(uint)inner_dim;
  }
  uVar5 = 0;
  if (0 < m2_cols) {
    uVar5 = (ulong)(uint)m2_cols;
  }
  uVar1 = (ulong)(uint)m1_rows;
  if (m1_rows < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    pdVar2 = m2;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      dVar9 = 0.0;
      pdVar8 = pdVar2;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        dVar9 = dVar9 + m1[uVar6] * *pdVar8;
        pdVar8 = pdVar8 + m2_cols;
      }
      *res = dVar9;
      res = res + 1;
      pdVar2 = pdVar2 + 1;
    }
    m1 = m1 + inner_dim;
  }
  return;
}

Assistant:

static inline void multiply_mat(const double *m1, const double *m2, double *res,
                                const int m1_rows, const int inner_dim,
                                const int m2_cols) {
  double sum;

  int row, col, inner;
  for (row = 0; row < m1_rows; ++row) {
    for (col = 0; col < m2_cols; ++col) {
      sum = 0;
      for (inner = 0; inner < inner_dim; ++inner)
        sum += m1[row * inner_dim + inner] * m2[inner * m2_cols + col];
      *(res++) = sum;
    }
  }
}